

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.hh
# Opt level: O2

void __thiscall Varnode::Varnode(Varnode *this,int4 s,Address *m,Datatype *dt)

{
  AddrSpace *pAVar1;
  uintb uVar2;
  
  pAVar1 = m->base;
  (this->loc).base = pAVar1;
  uVar2 = m->offset;
  (this->loc).offset = uVar2;
  (this->lociter)._M_node = (_Base_ptr)0x0;
  (this->defiter)._M_node = (_Base_ptr)0x0;
  (this->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->descend;
  (this->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->descend;
  (this->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node._M_size =
       0;
  this->cover = (Cover *)0x0;
  this->size = s;
  this->def = (PcodeOp *)0x0;
  this->type = dt;
  this->high = (HighVariable *)0x0;
  this->mapentry = (SymbolEntry *)0x0;
  this->consumed = 0xffffffffffffffff;
  this->mergegroup = 0;
  this->addlflags = 0;
  if (pAVar1 == (AddrSpace *)0x0) {
    this->flags = 0;
    return;
  }
  if (pAVar1->type != IPTR_CONSTANT) {
    if ((pAVar1->type & ~IPTR_PROCESSOR) == IPTR_FSPEC) {
      this->flags = 0x2000004;
    }
    else {
      this->flags = 0x2000000;
    }
    this->nzm = 0xffffffffffffffff;
    return;
  }
  this->flags = 2;
  this->nzm = uVar2;
  return;
}

Assistant:

inline Address::Address(const Address &op2) {
  base = op2.base;
  offset = op2.offset;
}